

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::i2p_peer::i2p_peer
          (i2p_peer *this,string_view dest,bool connectable_,peer_source_flags_t src)

{
  undefined1 *puVar1;
  char *__dest;
  int iVar2;
  undefined7 in_register_00000009;
  size_t __n;
  int iVar3;
  
  __n = dest._M_len;
  iVar2 = (int)CONCAT71(in_register_00000009,connectable_) * 0x20;
  iVar3 = (src.m_val & 0x3f) * 0x20000;
  *(undefined8 *)((long)&(this->super_torrent_peer).connection + 3) = 0;
  *(undefined8 *)((long)&(this->super_torrent_peer).peer_rank + 3) = 0;
  (this->super_torrent_peer).prev_amount_upload = 0;
  (this->super_torrent_peer).prev_amount_download = 0;
  (this->super_torrent_peer).connection = (peer_connection_interface *)0x0;
  *(int *)&(this->super_torrent_peer).field_0x1b = iVar3 + iVar2 + 0x10000000;
  puVar1 = &(this->super_torrent_peer).field_0x1f;
  *puVar1 = *puVar1 & 0xfe;
  __dest = (char *)operator_new__(__n + 1);
  (this->destination).m_ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,dest._M_str,__n);
  }
  __dest[__n] = '\0';
  *(uint *)&(this->super_torrent_peer).field_0x1b = iVar3 + iVar2 | 0x12000000;
  return;
}

Assistant:

i2p_peer::i2p_peer(string_view dest, bool connectable_
		, peer_source_flags_t const src)
		: torrent_peer(0, connectable_, src)
		, destination(dest)
	{
		is_v6_addr = false;
		is_i2p_addr = true;
#if TORRENT_USE_RTC
        is_rtc_addr = false;
#endif
	}